

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_StageSetup(ARKodeMem ark_mem)

{
  uint uVar1;
  void *pvVar2;
  realtype *c;
  N_Vector *X;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    iVar3 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","mriStep_StageSetup",
                    "Time step module memory is NULL.");
  }
  else {
    uVar1 = *(uint *)((long)pvVar2 + 0x88);
    c = *(realtype **)((long)pvVar2 + 0x198);
    dVar8 = ark_mem->h *
            *(double *)
             (*(long *)((long)pvVar2 + 0x68) +
             (long)*(int *)(*(long *)((long)pvVar2 + 0x50) + (long)(int)uVar1 * 4) * 8);
    X = *(N_Vector **)((long)pvVar2 + 0x1a0);
    *(double *)((long)pvVar2 + 0xa8) = dVar8;
    if (ark_mem->firststage == 0) {
      dVar8 = dVar8 / *(double *)((long)pvVar2 + 0xb0);
    }
    else {
      *(double *)((long)pvVar2 + 0xb0) = dVar8;
      dVar8 = 1.0;
    }
    *(double *)((long)pvVar2 + 0xb8) = dVar8;
    *X = ark_mem->ycur;
    *c = 1.0;
    c[1] = -1.0;
    X[1] = *(N_Vector *)((long)pvVar2 + 0x78);
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    iVar3 = 2;
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if ((*(int *)((long)pvVar2 + 0x18) != 0) &&
         (lVar7 = (long)*(int *)(*(long *)((long)pvVar2 + 0x50) + uVar5 * 4), -1 < lVar7)) {
        c[iVar3] = ark_mem->h * *(double *)(*(long *)((long)pvVar2 + 0x60) + lVar7 * 8);
        X[iVar3] = *(N_Vector *)(*(long *)((long)pvVar2 + 0x28) + lVar7 * 8);
        iVar3 = iVar3 + 1;
      }
      if ((*(int *)((long)pvVar2 + 0x1c) != 0) &&
         (lVar7 = (long)*(int *)(*(long *)((long)pvVar2 + 0x50) + uVar5 * 4), -1 < lVar7)) {
        c[iVar3] = ark_mem->h * *(double *)(*(long *)((long)pvVar2 + 0x68) + lVar7 * 8);
        X[iVar3] = *(N_Vector *)(*(long *)((long)pvVar2 + 0x30) + lVar7 * 8);
        iVar3 = iVar3 + 1;
      }
    }
    iVar4 = N_VLinearCombination(iVar3,c,X,*(N_Vector *)((long)pvVar2 + 0x70));
    iVar3 = -0x1c;
    if (iVar4 == 0) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mriStep_StageSetup(ARKodeMem ark_mem)
{
  /* local data */
  ARKodeMRIStepMem step_mem;
  int retval, i, j, nvec;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_StageSetup", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma (if the method contains an implicit component) */
  step_mem->gamma = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[i]];

  if (ark_mem->firststage)
    step_mem->gammap = step_mem->gamma;
  step_mem->gamrat = (ark_mem->firststage) ?
    ONE : step_mem->gamma / step_mem->gammap;  /* protect x/x != 1.0 */

  /* set cvals and Xvecs for setting stage data */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = -ONE;
  Xvecs[1] = step_mem->zpred;
  nvec     = 2;

  for (j = 0; j < i; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      cvals[nvec] = ark_mem->h * step_mem->Ae_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      cvals[nvec] = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* return with success */
  return (ARK_SUCCESS);
}